

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

int pfl_accepting(Plug *p,accept_fn_t constructor,accept_ctx_t ctx)

{
  Channel *chan;
  Socket *s;
  char *pcVar1;
  strbuf *psVar2;
  SshChannel *sc;
  int iVar3;
  Plug *plug;
  
  chan = portfwd_raw_new((ConnectionLayer *)p[-5].vt,&plug,false);
  s = (*constructor)((accept_ctx_t)ctx.p,plug);
  pcVar1 = (*s->vt->socket_error)(s);
  if (pcVar1 == (char *)0x0) {
    if (*(char *)&p[-3].vt == '\x01') {
      *(Socket **)&chan[-4].initial_fixed_window_size = s;
      *(undefined4 *)((long)&chan[-3].vt + 4) = 1;
      psVar2 = strbuf_new();
      *(strbuf **)&chan[-2].initial_fixed_window_size = psVar2;
      chan[-1].vt = (ChannelVtable *)0x0;
      *(undefined4 *)&chan[-2].vt = 0;
      iVar3 = 0;
      (*s->vt->set_frozen)(s,false);
    }
    else {
      pcVar1 = dupstr((char *)p[-2].vt);
      *(char **)&chan[-3].initial_fixed_window_size = pcVar1;
      iVar3 = *(int *)&p[-1].vt;
      *(int *)&chan[-2].vt = iVar3;
      sc = wrap_lportfwd_open((ConnectionLayer *)p[-5].vt,pcVar1,iVar3,s,chan);
      portfwd_raw_setup(chan,s,sc);
      iVar3 = 0;
    }
  }
  else {
    portfwd_raw_free(chan);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int pfl_accepting(Plug *p, accept_fn_t constructor, accept_ctx_t ctx)
{
    struct PortListener *pl = container_of(p, struct PortListener, plug);
    struct PortForwarding *pf;
    Channel *chan;
    Plug *plug;
    Socket *s;
    const char *err;

    chan = portfwd_raw_new(pl->cl, &plug, false);
    s = constructor(ctx, plug);
    if ((err = sk_socket_error(s)) != NULL) {
        portfwd_raw_free(chan);
        return 1;
    }

    pf = container_of(chan, struct PortForwarding, chan);

    if (pl->is_dynamic) {
        pf->s = s;
        pf->socks_state = SOCKS_INITIAL;
        pf->socksbuf = strbuf_new();
        pf->socksbuf_consumed = 0;
        pf->port = 0;                  /* "hostname" buffer is so far empty */
        sk_set_frozen(s, false);       /* we want to receive SOCKS _now_! */
    } else {
        pf->hostname = dupstr(pl->hostname);
        pf->port = pl->port;
        portfwd_raw_setup(
            chan, s,
            wrap_lportfwd_open(pl->cl, pf->hostname, pf->port, s, &pf->chan));
    }

    return 0;
}